

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O2

bool bc7decomp::unpack_bc7_mode1_3_7(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  uint8_t uVar1;
  uint32_t i_2;
  uint32_t uVar2;
  undefined4 extraout_var;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  uint32_t e;
  long lVar5;
  color_rgba *pcVar6;
  color_rgba *pcVar7;
  uint32_t c;
  byte bVar8;
  uint uVar9;
  long lVar10;
  uint32_t i_1;
  ulong uVar11;
  uint32_t p;
  uint uVar12;
  uint32_t bit_offset;
  color_rgba (*local_110) [8];
  long local_108;
  color_rgba *local_100;
  uint32_t local_f8;
  uint32_t local_f4;
  ulong local_f0;
  ulong local_e8;
  color_rgba *local_e0;
  color_rgba endpoints [4];
  uint32_t pbits [4];
  color_rgba block_colors [2] [8];
  uint32_t weights [16];
  
  uVar12 = (uint)(mode == 1);
  local_110 = (color_rgba (*) [8])0x5;
  if (mode != 7) {
    local_110 = (color_rgba (*) [8])(ulong)(uVar12 ^ 7);
  }
  bit_offset = 0;
  local_f4 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,mode + 1);
  local_f8 = 1 << ((byte)mode & 0x1f);
  if (local_f4 == local_f8) {
    uVar12 = uVar12 | 2;
    local_108 = (ulong)(mode != 1) * 2 + 2;
    lVar10 = (ulong)(mode == 7) + 3;
    local_e8 = (ulong)mode;
    local_e0 = pPixels;
    uVar2 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,6);
    local_f0 = CONCAT44(extraout_var,uVar2);
    pcVar7 = endpoints;
    lVar3 = 0;
    while (lVar3 != lVar10) {
      local_100 = (color_rgba *)lVar3;
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        uVar2 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,(uint32_t)local_110);
        pcVar7[lVar5].field_0.m_comps[0] = (uint8_t)uVar2;
      }
      pcVar7 = (color_rgba *)((long)&pcVar7->field_0 + 1);
      lVar3 = (long)local_100 + 1;
    }
    for (lVar3 = 0; local_108 != lVar3; lVar3 = lVar3 + 1) {
      uVar2 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,1);
      pbits[lVar3] = uVar2;
    }
    uVar11 = local_f0 & 0xffffffff;
    uVar4 = 0;
    do {
      if (uVar4 == 0) {
LAB_0010a88b:
        uVar9 = uVar12 - 1;
      }
      else {
        if (uVar4 == 0x10) goto LAB_0010a8a7;
        uVar9 = uVar12;
        if (uVar4 == (byte)g_bc7_table_anchor_index_second_subset[uVar11]) goto LAB_0010a88b;
      }
      uVar2 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,uVar9);
      weights[uVar4] = uVar2;
      uVar4 = uVar4 + 1;
    } while( true );
  }
LAB_0010a9fc:
  return local_f4 == local_f8;
LAB_0010a8a7:
  pcVar7 = endpoints;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      bVar8 = 0xff;
      if (lVar10 != lVar5) {
        uVar9 = ((uint)(pcVar7->field_0).m_comps[lVar5] * 2 |
                pbits[(uint)lVar3 >> ((int)local_e8 == 1)]) << (((byte)local_110 ^ 7) & 0x1f);
        bVar8 = (byte)(uVar9 >> ((byte)local_110 + 1 & 0x1f)) | (byte)uVar9;
      }
      (pcVar7->field_0).m_comps[lVar5] = bVar8;
    }
    pcVar7 = pcVar7 + 1;
  }
  pcVar7 = block_colors[0];
  pcVar6 = endpoints + 1;
  for (local_108 = 0; local_108 != 2; local_108 = local_108 + 1) {
    local_110 = block_colors + local_108;
    local_100 = pcVar7;
    for (lVar3 = 0; (uint32_t)lVar3 >> (sbyte)uVar12 == 0; lVar3 = lVar3 + 1) {
      for (lVar5 = 0; lVar10 != lVar5; lVar5 = lVar5 + 1) {
        uVar2 = bc7_interp((uint)pcVar6[-1].field_0.m_comps[lVar5],
                           (uint)(pcVar6->field_0).m_comps[lVar5],(uint32_t)lVar3,uVar12);
        (pcVar7->field_0).m_comps[lVar5] = (uint8_t)uVar2;
      }
      uVar1 = 0xff;
      if ((int)local_e8 == 7) {
        uVar1 = (*local_110)[lVar3].field_0.m_comps[3];
      }
      (*local_110)[lVar3].field_0.m_comps[3] = uVar1;
      pcVar7 = pcVar7 + 1;
    }
    pcVar6 = pcVar6 + 2;
    pcVar7 = local_100 + 8;
  }
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    local_e0[lVar3].field_0 =
         block_colors[(byte)g_bc7_partition2[(ulong)(uint)((int)local_f0 << 4) + lVar3]]
         [weights[lVar3]].field_0;
  }
  goto LAB_0010a9fc;
}

Assistant:

bool unpack_bc7_mode1_3_7(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	//const uint32_t SUBSETS = 2;
	const uint32_t ENDPOINTS = 4;
	const uint32_t COMPS = (mode == 7) ? 4 : 3;
	const uint32_t WEIGHT_BITS = (mode == 1) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 7) ? 5 : ((mode == 1) ? 6 : 7);
	const uint32_t PBITS = (mode == 1) ? 2 : 4;
	const uint32_t SHARED_PBITS = (mode == 1) ? true : false;
	const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t part = read_bits32(pBuf, bit_offset, 6);

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);
		
	uint32_t pbits[4];
	for (uint32_t p = 0; p < PBITS; p++)
		pbits[p] = read_bits32(pBuf, bit_offset, 1);
						
	uint32_t weights[16];
	for (uint32_t i = 0; i < 16; i++)
		weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == g_bc7_table_anchor_index_second_subset[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);
		
	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)((c == ((mode == 7U) ? 4U : 3U)) ? 255 : bc7_dequant(endpoints[e][c], pbits[SHARED_PBITS ? (e >> 1) : e], ENDPOINT_BITS));
		
	color_rgba block_colors[2][8];
	for (uint32_t s = 0; s < 2; s++)
		for (uint32_t i = 0; i < WEIGHT_VALS; i++)
		{
			for (uint32_t c = 0; c < COMPS; c++)
				block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
			block_colors[s][i][3] = (COMPS == 3) ? 255 : block_colors[s][i][3];
		}

	for (uint32_t i = 0; i < 16; i++)
		pPixels[i] = block_colors[g_bc7_partition2[part * 16 + i]][weights[i]];

	return true;
}